

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Electromagnetic_Emission_PDU *this)

{
  pointer pEVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  pointer pEVar3;
  KStringStream ss;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Header7::GetAsString_abi_cxx11_(&local_270,&this->super_Header);
  poVar2 = std::operator<<(local_1a0,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"-Electromagnetic Emission PDU-\n");
  poVar2 = std::operator<<(poVar2,"Emitting Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_EmittingEntityID);
  UTILS::IndentString(&local_1d0,&local_1f0,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_EventID);
  UTILS::IndentString(&local_210,&local_230,Tabs_00,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"State Update Indicator:     ");
  DATA_TYPE::ENUMS::GetEnumAsStringStateUpdateIndicator_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)this->m_ui8StateUpdateIndicator,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Emission Systems: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumberOfEmissionSystems);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_270);
  pEVar1 = (this->m_vEmissionSystem).
           super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar3 = (this->m_vEmissionSystem).
                super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_270,pEVar3);
    std::operator<<(local_1a0,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString Electromagnetic_Emission_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Electromagnetic Emission PDU-\n"
       << "Emitting Entity ID:\n"
       << IndentString( m_EmittingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "State Update Indicator:     " << GetEnumAsStringStateUpdateIndicator( m_ui8StateUpdateIndicator ) << "\n"
       << "Number Of Emission Systems: " << ( KUINT16 )m_ui8NumberOfEmissionSystems  << "\n";

    vector<EmissionSystem>::const_iterator citr = m_vEmissionSystem.begin();
    vector<EmissionSystem>::const_iterator citrEnd = m_vEmissionSystem.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}